

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O2

SurfaceFaceColorQuantity * __thiscall
polyscope::SurfaceMesh::addFaceColorQuantityImpl
          (SurfaceMesh *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *colors)

{
  SurfaceFaceColorQuantity *this_00;
  _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  _Stack_78;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  QuantityStructure<polyscope::SurfaceMesh>::checkForQuantityWithNameAndDeleteOrError
            (&this->super_QuantityStructure<polyscope::SurfaceMesh>,&local_40,true);
  std::__cxx11::string::~string((string *)&local_40);
  this_00 = (SurfaceFaceColorQuantity *)operator_new(0x2d8);
  std::__cxx11::string::string((string *)&local_60,(string *)name);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)&_Stack_78,colors);
  SurfaceFaceColorQuantity::SurfaceFaceColorQuantity
            (this_00,&local_60,this,
             (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)&_Stack_78);
  std::
  _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&_Stack_78);
  std::__cxx11::string::~string((string *)&local_60);
  QuantityStructure<polyscope::SurfaceMesh>::addQuantity
            (&this->super_QuantityStructure<polyscope::SurfaceMesh>,(QuantityType *)this_00,true);
  return this_00;
}

Assistant:

SurfaceFaceColorQuantity* SurfaceMesh::addFaceColorQuantityImpl(std::string name,
                                                                const std::vector<glm::vec3>& colors) {
  checkForQuantityWithNameAndDeleteOrError(name);
  SurfaceFaceColorQuantity* q = new SurfaceFaceColorQuantity(name, *this, colors);
  addQuantity(q);
  return q;
}